

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
cxxopts::OptionValue::as<std::__cxx11::string>(OptionValue *this)

{
  bool bVar1;
  domain_error *this_00;
  element_type *peVar2;
  abstract_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  OptionValue *this_local;
  
  bVar1 = std::operator==(&this->m_value,(nullptr_t)0x0);
  if (bVar1) {
    this_00 = (domain_error *)__cxa_allocate_exception(0x10);
    std::domain_error::domain_error(this_00,"No value");
    __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  }
  peVar2 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)this);
  this_01 = (abstract_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)__dynamic_cast(peVar2,&Value::typeinfo,
                              &values::standard_value<std::__cxx11::string>::typeinfo,0);
  if (this_01 ==
      (abstract_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)0x0) {
    __cxa_bad_cast();
  }
  pbVar3 = values::
           abstract_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::get(this_01);
  return pbVar3;
}

Assistant:

const T &as() const {
    if (m_value == nullptr) {
      throw std::domain_error("No value");
    }

#ifdef CXXOPTS_NO_RTTI
    return static_cast<const values::standard_value<T> &>(*m_value).get();
#else
    return dynamic_cast<const values::standard_value<T> &>(*m_value).get();
#endif
  }